

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rbuObjIterPrepareAll(sqlite3rbu *p,RbuObjIter *pIter,int nOffset)

{
  char **pzErrmsg;
  int *pRc;
  byte bVar1;
  uchar uVar2;
  sqlite3 *psVar3;
  sqlite3_stmt *pStmt;
  sqlite3rbu *psVar4;
  sqlite3rbu *psVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Vdbe *pVm;
  char *pcVar9;
  Mem *pMVar10;
  i64 iVar11;
  uchar *puVar12;
  char **ppcVar13;
  int *piVar14;
  u8 *puVar15;
  char *pcVar16;
  char *pcVar17;
  ulong uVar18;
  int i_1;
  char **in_RCX;
  long lVar19;
  undefined7 uVar20;
  uint i;
  uint uVar21;
  uchar *puVar22;
  long lVar23;
  char *pcVar24;
  char *pcVar25;
  uint uVar26;
  sqlite3_stmt *psVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  sqlite3_stmt *local_c0;
  char *local_b8;
  char *local_b0;
  sqlite3rbu *local_a8;
  char **local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  sqlite3_stmt *local_80;
  sqlite3_stmt *pList;
  sqlite3_stmt *psStack_70;
  sqlite3_stmt *local_68;
  sqlite3_stmt *apsStack_60 [2];
  char *local_50;
  char *local_48;
  i64 local_40;
  sqlite3_stmt **local_38;
  
  if (pIter->pSelect != (sqlite3_stmt *)0x0) goto LAB_001300f4;
  if (pIter->azTblCol == (char **)0x0) {
    local_90 = (char *)CONCAT44(local_90._4_4_,nOffset);
    local_80 = (sqlite3_stmt *)0x0;
    pcVar9 = pIter->zTbl;
    local_68 = (sqlite3_stmt *)0x0;
    apsStack_60[0] = (sqlite3_stmt *)0x0;
    pList = (sqlite3_stmt *)0x0;
    psStack_70 = (sqlite3_stmt *)0x0;
    iVar7 = 0;
    pIter->eType = 0;
    pIter->iPkTnum = 0;
    psVar3 = p->dbMain;
    pzErrmsg = &p->zErrmsg;
    pcVar25 = sqlite3_mprintf("SELECT (sql LIKE \'create virtual%%\'), rootpage  FROM sqlite_master WHERE name=%Q"
                              ,pcVar9);
    iVar6 = prepareFreeAndCollectError(psVar3,&pList,pzErrmsg,pcVar25);
    psVar27 = pList;
    p->rc = iVar6;
    local_a8 = p;
    if ((iVar6 == 0) && (iVar6 = sqlite3_step(pList), iVar7 = 0, iVar6 == 100)) {
      iVar7 = 0;
      pMVar10 = columnMem(psVar27,0);
      iVar11 = sqlite3VdbeIntValue(pMVar10);
      columnMallocFailure(psVar27);
      iVar6 = 5;
      if ((int)iVar11 == 0) {
        pMVar10 = columnMem(psVar27,1);
        iVar11 = sqlite3VdbeIntValue(pMVar10);
        iVar7 = (int)iVar11;
        columnMallocFailure(psVar27);
        psVar4 = local_a8;
        psVar3 = local_a8->dbMain;
        pcVar25 = sqlite3_mprintf("PRAGMA index_list=%Q",pcVar9);
        iVar6 = prepareFreeAndCollectError(psVar3,&psStack_70,pzErrmsg,pcVar25);
        psVar27 = psStack_70;
        psVar4->rc = iVar6;
        if (iVar6 == 0) {
          do {
            iVar6 = sqlite3_step(psVar27);
            psVar4 = local_a8;
            if (iVar6 != 100) {
              psVar3 = local_a8->dbMain;
              pcVar9 = sqlite3_mprintf("PRAGMA table_info=%Q",pcVar9);
              iVar6 = prepareFreeAndCollectError(psVar3,apsStack_60,pzErrmsg,pcVar9);
              psVar27 = apsStack_60[0];
              psVar4->rc = iVar6;
              if (iVar6 != 0) goto LAB_0012ea56;
              goto LAB_0012f5b3;
            }
            puVar12 = sqlite3_column_text(psVar27,3);
            puVar22 = sqlite3_column_text(psVar27,1);
            psVar4 = local_a8;
          } while ((puVar22 == (uchar *)0x0 || puVar12 == (uchar *)0x0) || (*puVar12 != 'p'));
          psVar3 = local_a8->dbMain;
          pcVar9 = sqlite3_mprintf("SELECT rootpage FROM sqlite_master WHERE name = %Q",puVar22);
          iVar6 = prepareFreeAndCollectError(psVar3,&local_68,pzErrmsg,pcVar9);
          psVar27 = local_68;
          psVar4->rc = iVar6;
          if (iVar6 == 0) {
            iVar8 = sqlite3_step(local_68);
            iVar6 = 4;
            if (iVar8 == 100) {
              iVar6 = sqlite3_column_int(psVar27,0);
              pIter->iPkTnum = iVar6;
              iVar6 = 3;
            }
            goto LAB_0012ea52;
          }
        }
      }
      else {
LAB_0012ea52:
        pIter->eType = iVar6;
      }
    }
LAB_0012ea56:
    p = local_a8;
    pRc = &local_a8->rc;
    lVar23 = 0;
    do {
      rbuFinalize(p,(&pList)[lVar23]);
      lVar23 = lVar23 + 1;
    } while (lVar23 != 4);
    if ((*pRc == 0) && (pIter->eType == 0)) {
      *pRc = 1;
      pcVar9 = sqlite3_mprintf("no such table: %s",pIter->zTbl);
      *pzErrmsg = pcVar9;
    }
    if (*pRc != 0) goto LAB_001300f4;
    if (pIter->zIdx == (char *)0x0) {
      pIter->iTnum = iVar7;
    }
    psVar3 = p->dbRbu;
    bVar28 = false;
    in_RCX = (char **)sqlite3_mprintf("SELECT * FROM \'%q\'",pIter->zDataTbl);
    iVar7 = prepareFreeAndCollectError(psVar3,&local_80,pzErrmsg,(char *)in_RCX);
    p->rc = iVar7;
    uVar21 = 0;
    if (iVar7 == 0) {
      if (local_80 == (sqlite3_stmt *)0x0) {
        uVar18 = 0;
      }
      else {
        uVar18 = (ulong)*(ushort *)(local_80 + 0xc0);
      }
      uVar21 = (uint)uVar18;
      ppcVar13 = (char **)rbuMalloc(p,uVar18 * 0x17);
      if (ppcVar13 != (char **)0x0) {
        pIter->azTblCol = ppcVar13;
        in_RCX = (char **)(ulong)(uVar21 * 8);
        pIter->azTblType = (char **)((long)ppcVar13 + (long)in_RCX);
        piVar14 = (int *)((long)ppcVar13 + (long)in_RCX + (long)in_RCX);
        pIter->aiSrcOrder = piVar14;
        piVar14 = piVar14 + uVar18;
        pIter->abTblPk = (u8 *)piVar14;
        puVar15 = (u8 *)((long)piVar14 + uVar18);
        pIter->abNotNull = puVar15;
        pIter->abIndexed = puVar15 + uVar18;
      }
    }
    psVar27 = local_80;
    if ((uVar21 != 0) && (*pRc == 0)) {
      bVar28 = false;
      uVar26 = 1;
      do {
        in_RCX = (char **)0x0;
        pcVar9 = (char *)columnName(psVar27,uVar26 - 1,0,0);
        iVar7 = sqlite3_strnicmp("rbu_",pcVar9,4);
        if (iVar7 == 0) {
          if (pcVar9 != (char *)0x0) {
            iVar7 = sqlite3StrICmp("rbu_rowid",pcVar9);
            in_RCX = (char **)0x0;
            if (iVar7 == 0) {
              bVar28 = true;
            }
          }
        }
        else {
          pcVar9 = rbuStrndup(pcVar9,pRc);
          pIter->aiSrcOrder[pIter->nTblCol] = pIter->nTblCol;
          in_RCX = pIter->azTblCol;
          iVar7 = pIter->nTblCol;
          pIter->nTblCol = iVar7 + 1;
          in_RCX[iVar7] = pcVar9;
        }
      } while ((*pRc == 0) && (bVar29 = uVar26 < uVar21, uVar26 = uVar26 + 1, bVar29));
    }
    sqlite3_finalize(local_80);
    local_80 = (sqlite3_stmt *)0x0;
    if ((*pRc == 0) &&
       ((p->zTarget != (char *)0x0 &&
        (in_RCX = (char **)0x0, bVar28 != ((pIter->eType & 0xfffffffbU) == 1))))) {
      *pRc = 1;
      pcVar9 = "may not have";
      if (bVar28 == false) {
        pcVar9 = "requires";
      }
      pcVar9 = sqlite3_mprintf("table %q %s rbu_rowid column",pIter->zDataTbl,pcVar9);
      *pzErrmsg = pcVar9;
      in_RCX = pzErrmsg;
    }
    if (*pRc == 0) {
      psVar3 = p->dbMain;
      in_RCX = (char **)sqlite3_mprintf("PRAGMA table_info(%Q)",pIter->zTbl);
      iVar7 = prepareFreeAndCollectError(psVar3,&local_80,pzErrmsg,(char *)in_RCX);
      p->rc = iVar7;
    }
    psVar27 = local_80;
    iVar7 = 0;
    do {
      if ((*pRc != 0) || (iVar6 = sqlite3_step(psVar27), iVar6 != 100)) break;
      puVar12 = sqlite3_column_text(psVar27,1);
      if (puVar12 != (uchar *)0x0) {
        iVar6 = pIter->nTblCol;
        iVar8 = iVar7;
        if (iVar7 < iVar6) {
          ppcVar13 = pIter->azTblCol;
          lVar23 = 0;
          do {
            iVar8 = strcmp((char *)puVar12,ppcVar13[iVar7 + lVar23]);
            p = local_a8;
            if (iVar8 == 0) {
              iVar8 = (int)lVar23 + iVar7;
              break;
            }
            lVar23 = lVar23 + 1;
            iVar8 = iVar6;
          } while ((long)iVar6 - (long)iVar7 != lVar23);
        }
        if (iVar8 == iVar6) {
          *pRc = 1;
          pcVar9 = sqlite3_mprintf("column missing from %q: %s",pIter->zDataTbl,puVar12);
          *pzErrmsg = pcVar9;
          in_RCX = pzErrmsg;
        }
        else {
          pMVar10 = columnMem(psVar27,5);
          local_b0 = (char *)sqlite3VdbeIntValue(pMVar10);
          columnMallocFailure(psVar27);
          pMVar10 = columnMem(psVar27,3);
          local_98 = (char *)sqlite3VdbeIntValue(pMVar10);
          columnMallocFailure(psVar27);
          puVar22 = sqlite3_column_text(psVar27,2);
          if (iVar8 != iVar7) {
            piVar14 = pIter->aiSrcOrder;
            iVar6 = piVar14[iVar8];
            piVar14[iVar8] = piVar14[iVar7];
            piVar14[iVar7] = iVar6;
            ppcVar13 = pIter->azTblCol;
            pcVar9 = ppcVar13[iVar8];
            ppcVar13[iVar8] = ppcVar13[iVar7];
            pIter->azTblCol[iVar7] = pcVar9;
          }
          pcVar9 = rbuStrndup((char *)puVar22,pRc);
          pIter->azTblType[iVar7] = pcVar9;
          pIter->abTblPk[iVar7] = ((ulong)local_b0 & 0xffffffff) != 0;
          in_RCX = (char **)((ulong)local_98 & 0xff | (ulong)local_b0 & 0xffffffff);
          pIter->abNotNull[iVar7] = in_RCX != (char **)0x0;
          iVar7 = iVar7 + 1;
        }
      }
    } while (puVar12 != (uchar *)0x0);
    rbuFinalize(p,psVar27);
    pList = (sqlite3_stmt *)0x0;
    if (p->rc == 0) {
      memcpy(pIter->abIndexed,pIter->abTblPk,(long)pIter->nTblCol);
      psVar3 = p->dbMain;
      in_RCX = (char **)sqlite3_mprintf("PRAGMA main.index_list = %Q",pIter->zTbl);
      iVar7 = prepareFreeAndCollectError(psVar3,&pList,pzErrmsg,(char *)in_RCX);
      p->rc = iVar7;
    }
    psVar27 = pList;
    pIter->nIndex = 0;
    bVar28 = false;
    do {
      if ((*pRc != 0) || (iVar7 = sqlite3_step(psVar27), iVar7 != 100)) break;
      puVar12 = sqlite3_column_text(psVar27,1);
      pMVar10 = columnMem(psVar27,4);
      iVar11 = sqlite3VdbeIntValue(pMVar10);
      columnMallocFailure(psVar27);
      local_c0 = (sqlite3_stmt *)0x0;
      if (puVar12 != (uchar *)0x0) {
        if ((int)iVar11 != 0) {
          memset(pIter->abIndexed,1,(long)pIter->nTblCol);
        }
        psVar3 = p->dbMain;
        in_RCX = (char **)sqlite3_mprintf("PRAGMA main.index_xinfo = %Q",puVar12);
        iVar7 = prepareFreeAndCollectError(psVar3,&local_c0,pzErrmsg,(char *)in_RCX);
        pStmt = local_c0;
        p->rc = iVar7;
        while ((iVar7 == 0 && (iVar7 = sqlite3_step(pStmt), iVar7 == 100))) {
          pMVar10 = columnMem(pStmt,1);
          iVar11 = sqlite3VdbeIntValue(pMVar10);
          columnMallocFailure(pStmt);
          if (-1 < (int)(uint)iVar11) {
            pIter->abIndexed[(uint)iVar11 & 0x7fffffff] = '\x01';
          }
          iVar7 = *pRc;
        }
        rbuFinalize(p,local_c0);
        pIter->nIndex = pIter->nIndex + 1;
        bVar28 = true;
      }
    } while (puVar12 != (uchar *)0x0);
    if (pIter->eType == 4) {
      pIter->nIndex = pIter->nIndex + -1;
    }
    rbuFinalize(p,psVar27);
    if (!bVar28) {
      pIter->abIndexed = (u8 *)0x0;
    }
    nOffset = (uint)local_90;
  }
  if (p->rc != 0) goto LAB_001300f4;
  iVar7 = pIter->iTnum;
  pcVar9 = pIter->zIdx;
  if (nOffset == 0) {
LAB_0012e672:
    local_48 = (char *)0x0;
  }
  else {
    local_48 = sqlite3_mprintf(" LIMIT -1 OFFSET %d",(ulong)(uint)nOffset);
    if (local_48 == (char *)0x0) {
      p->rc = 7;
      goto LAB_0012e672;
    }
  }
  local_38 = &pIter->pSelect;
  local_a0 = &p->zErrmsg;
  if (pcVar9 != (char *)0x0) {
    local_88 = pIter->zTbl;
    iVar6 = p->rc;
    pList = (sqlite3_stmt *)0x0;
    if (iVar6 == 0) {
      psVar3 = p->dbMain;
      pcVar9 = sqlite3_mprintf("PRAGMA main.index_xinfo = %Q",pIter->zIdx);
      iVar6 = prepareFreeAndCollectError(psVar3,&pList,local_a0,pcVar9);
    }
    psVar27 = pList;
    bVar28 = iVar6 == 0;
    local_50 = (char *)CONCAT44(local_50._4_4_,iVar7);
    if (bVar28) {
      iVar7 = sqlite3_step(pList);
      if (iVar7 != 100) {
        bVar28 = true;
        goto LAB_0012eb4f;
      }
      local_d0 = (char *)0x0;
      local_98 = (char *)((ulong)local_98 & 0xffffffff00000000);
      pcVar25 = "";
      pcVar9 = "";
      local_c8 = (char *)0x0;
      local_b0 = (char *)0x0;
      local_d8 = (char *)0x0;
      local_a8 = p;
      do {
        pMVar10 = columnMem(psVar27,1);
        iVar11 = sqlite3VdbeIntValue(pMVar10);
        columnMallocFailure(psVar27);
        pMVar10 = columnMem(psVar27,3);
        local_40 = sqlite3VdbeIntValue(pMVar10);
        columnMallocFailure(psVar27);
        puVar12 = sqlite3_column_text(psVar27,4);
        if ((int)(uint)iVar11 < 0) {
          if (pIter->eType == 2) {
            lVar23 = 0;
            do {
              lVar19 = lVar23;
              lVar23 = lVar19 + 1;
            } while (pIter->abTblPk[lVar19] == '\0');
            pcVar16 = pIter->azTblCol[lVar19];
            local_b8 = "INTEGER";
          }
          else {
            pcVar16 = ", rbu_rowid";
            if (local_a8->zTarget == (char *)0x0) {
              pcVar16 = ", _rowid_";
            }
            pcVar16 = pcVar16 + 2;
            local_b8 = "INTEGER";
          }
        }
        else {
          uVar21 = (uint)iVar11 & 0x7fffffff;
          pcVar16 = pIter->azTblCol[uVar21];
          local_b8 = pIter->azTblType[uVar21];
        }
        local_90 = pcVar9;
        local_d8 = sqlite3_mprintf("%z%s\"%w\" COLLATE %Q",local_d8,pcVar25,pcVar16,puVar12);
        if (pIter->bUnique == 0) {
LAB_0012e87f:
          pcVar9 = " DESC";
          if ((int)local_40 == 0) {
            pcVar9 = "";
          }
          uVar21 = (uint)local_98;
          local_c8 = sqlite3_mprintf("%z%s\"rbu_imp_%d%w\"%s",local_c8,pcVar25,
                                     (ulong)local_98 & 0xffffffff,pcVar16,pcVar9);
        }
        else {
          pMVar10 = columnMem(psVar27,5);
          iVar11 = sqlite3VdbeIntValue(pMVar10);
          columnMallocFailure(psVar27);
          if ((int)iVar11 != 0) goto LAB_0012e87f;
          uVar21 = (uint)local_98;
        }
        pcVar9 = sqlite3_mprintf("%z%s\"rbu_imp_%d%w\" %s COLLATE %Q",local_b0,pcVar25,(ulong)uVar21
                                 ,pcVar16,local_b8,puVar12);
        local_d0 = sqlite3_mprintf("%z%s\"rbu_imp_%d%w\" IS ?",local_d0,local_90,(ulong)uVar21);
        psVar27 = pList;
        bVar29 = local_d8 != (char *)0x0;
        bVar30 = local_c8 != (char *)0x0;
        bVar31 = pcVar9 != (char *)0x0;
        bVar32 = local_d0 != (char *)0x0;
        bVar28 = (bVar32 && bVar31) && (bVar30 && bVar29);
        local_98 = (char *)CONCAT44(local_98._4_4_,uVar21 + 1);
        local_b0 = pcVar9;
        if ((!bVar32 || !bVar31) || (!bVar30 || !bVar29)) break;
        iVar7 = sqlite3_step(pList);
        pcVar25 = ", ";
        pcVar9 = " AND ";
      } while (iVar7 == 100);
      iVar6 = 7;
      p = local_a8;
      if ((bVar32 && bVar31) && (bVar30 && bVar29)) {
        iVar6 = 0;
      }
    }
    else {
LAB_0012eb4f:
      local_d0 = (char *)0x0;
      local_98 = (char *)((ulong)local_98 & 0xffffffff00000000);
      local_c8 = (char *)0x0;
      local_b0 = (char *)0x0;
      local_d8 = (char *)0x0;
    }
    iVar7 = sqlite3_finalize(pList);
    if (!bVar28) {
      iVar7 = iVar6;
    }
    pcVar9 = local_b0;
    if (iVar7 != 0) {
      sqlite3_free(local_d8);
      sqlite3_free(local_b0);
      sqlite3_free(local_c8);
      sqlite3_free(local_d0);
      p->rc = iVar7;
      local_d0 = (char *)0x0;
      local_c8 = (char *)0x0;
      local_d8 = (char *)0x0;
      pcVar9 = (char *)0x0;
    }
    uVar21 = (uint)local_50;
    pcVar25 = rbuObjIterGetBindlist(p,(uint)local_98);
    pList = (sqlite3_stmt *)0x0;
    local_c0 = (sqlite3_stmt *)CONCAT44(local_c0._4_4_,p->rc);
    if (p->rc == 0) {
      iVar7 = prepareAndCollectError
                        (p->dbMain,&pList,local_a0,
                         "SELECT trim(sql) FROM sqlite_master WHERE type=\'index\' AND name=?");
      local_c0 = (sqlite3_stmt *)CONCAT44(local_c0._4_4_,iVar7);
    }
    psVar27 = pList;
    local_90 = pcVar25;
    if ((int)local_c0 == 0) {
      pcVar25 = (char *)0x0;
      iVar7 = bindText(pList,1,pIter->zIdx,-1,(_func_void_void_ptr *)0x0,'\x01');
      local_c0._0_4_ = iVar7;
      if (iVar7 == 0) {
        iVar7 = sqlite3_step(psVar27);
        pcVar25 = (char *)0x0;
        if ((iVar7 == 100) && (puVar12 = sqlite3_column_text(psVar27,0), puVar12 != (uchar *)0x0)) {
          uVar18 = 0;
          do {
            uVar21 = (uint)uVar18;
            bVar1 = puVar12[(int)uVar21];
            bVar28 = true;
            if (bVar1 < 0x5b) {
              switch(bVar1) {
              case 0x22:
              case 0x27:
switchD_0012ecd0_caseD_22:
                do {
                  do {
                    lVar23 = (long)(int)uVar18;
                    uVar18 = lVar23 + 1U & 0xffffffff;
                  } while (puVar12[lVar23 + 1] != bVar1);
                  uVar18 = lVar23 + 2;
                } while (puVar12[lVar23 + 2] == bVar1);
                uVar21 = (uint)(lVar23 + 1U);
                break;
              case 0x23:
              case 0x24:
              case 0x25:
              case 0x26:
                break;
              case 0x28:
                pcVar25 = (char *)(ulong)((int)pcVar25 + 1);
                break;
              case 0x29:
                uVar26 = (int)pcVar25 - 1;
                pcVar25 = (char *)(ulong)uVar26;
                if (uVar26 == 0) {
                  uVar21 = uVar21 + 1;
                  pcVar25 = (char *)0x0;
                  bVar28 = false;
                }
                break;
              default:
                if (bVar1 == 0) goto LAB_0012ed30;
              }
            }
            else {
              if (bVar1 == 0x60) goto switchD_0012ecd0_caseD_22;
              if (bVar1 == 0x5b) {
                puVar22 = puVar12 + (long)(int)uVar21 + 1;
                do {
                  uVar21 = (int)uVar18 + 1;
                  uVar18 = (ulong)uVar21;
                  uVar2 = *puVar22;
                  puVar22 = puVar22 + 1;
                } while (uVar2 != ']');
              }
            }
            if (!bVar28) goto LAB_0012ed30;
            uVar18 = (ulong)(uVar21 + 1);
          } while( true );
        }
      }
      goto LAB_0012f718;
    }
    pcVar25 = (char *)0x0;
    goto LAB_0012f734;
  }
  iVar7 = pIter->eType;
  uVar20 = (undefined7)((ulong)in_RCX >> 8);
  uVar21 = (uint)CONCAT71(uVar20,1);
  if ((iVar7 != 1) && (iVar7 != 5)) {
    if (iVar7 == 3) {
      uVar21 = (uint)CONCAT71(uVar20,p->zTarget == (char *)0x0);
    }
    else {
      uVar21 = 0;
    }
  }
  local_40 = CONCAT44(local_40._4_4_,uVar21);
  local_98 = pIter->zTbl;
  local_b0 = rbuObjIterGetBindlist(p,(uVar21 & 0xff) + pIter->nTblCol);
  local_c8 = rbuObjIterGetWhere(p,pIter);
  local_d0 = rbuObjIterGetOldlist(p,pIter,"old");
  local_90 = rbuObjIterGetOldlist(p,pIter,"new");
  if (pIter->nTblCol < 1) {
    local_d8 = (char *)0x0;
  }
  else {
    lVar23 = 0;
    local_d8 = (char *)0x0;
    pcVar9 = "";
    do {
      local_d8 = rbuMPrintf(p,"%z%s\"%w\"",local_d8,pcVar9,pIter->azTblCol[lVar23]);
      lVar23 = lVar23 + 1;
      pcVar9 = ", ";
    } while (lVar23 < pIter->nTblCol);
  }
  pIter->nCol = pIter->nTblCol;
  if ((p->rc == 0) && (pIter->eType != 5)) {
    local_88 = (char *)CONCAT44(local_88._4_4_,pIter->iTnum);
    pcVar9 = (char *)0x0;
    sqlite3_test_control(0x19,p->dbMain,"main");
    bVar28 = p->rc == 0;
    local_a8 = p;
    if (bVar28) {
      if (pIter->nTblCol < 1) {
        bVar28 = true;
        pcVar9 = (char *)0x0;
      }
      else {
        pcVar25 = "";
        pcVar9 = (char *)0x0;
        pcVar16 = "";
        lVar23 = 0;
        do {
          psVar4 = local_a8;
          pcVar17 = pIter->azTblCol[lVar23];
          pList = (sqlite3_stmt *)0x0;
          local_b8 = pcVar9;
          iVar7 = sqlite3_table_column_metadata
                            (local_a8->dbMain,"main",pIter->zTbl,pcVar17,(char **)0x0,
                             (char **)&pList,(int *)0x0,(int *)0x0,(int *)0x0);
          psVar5 = local_a8;
          psVar4->rc = iVar7;
          pcVar9 = pcVar25;
          if ((pIter->eType == 2) && (pcVar9 = "PRIMARY KEY ", pIter->abTblPk[lVar23] == '\0')) {
            pcVar9 = pcVar25;
          }
          pcVar24 = " NOT NULL";
          if (pIter->abNotNull[lVar23] == '\0') {
            pcVar24 = pcVar25;
          }
          pcVar9 = rbuMPrintf(local_a8,"%z%s\"%w\" %s %sCOLLATE %Q%s",local_b8,pcVar16,pcVar17,
                              pIter->azTblType[lVar23],pcVar9,pList,pcVar24);
          bVar28 = psVar5->rc == 0;
          if (!bVar28) break;
          lVar23 = lVar23 + 1;
          pcVar16 = ", ";
        } while (lVar23 < pIter->nTblCol);
      }
    }
    p = local_a8;
    local_b8 = pcVar9;
    if (pIter->eType == 4) {
      if (bVar28) {
        pList = (sqlite3_stmt *)0x0;
        local_c0 = (sqlite3_stmt *)0x0;
        psVar3 = local_a8->dbMain;
        pcVar9 = sqlite3_mprintf("PRAGMA main.index_list = %Q",pIter->zTbl);
        iVar7 = prepareFreeAndCollectError(psVar3,&pList,local_a0,pcVar9);
        psVar27 = pList;
        p->rc = iVar7;
        if (iVar7 == 0) {
          while (iVar7 = sqlite3_step(psVar27), iVar7 == 100) {
            puVar12 = sqlite3_column_text(psVar27,3);
            if ((puVar12 != (uchar *)0x0) && (iVar7 = strcmp((char *)puVar12,"pk"), iVar7 == 0)) {
              puVar12 = sqlite3_column_text(psVar27,1);
              if (puVar12 != (uchar *)0x0) {
                psVar3 = p->dbMain;
                pcVar9 = sqlite3_mprintf("PRAGMA main.index_xinfo = %Q",puVar12);
                iVar7 = prepareFreeAndCollectError(psVar3,&local_c0,local_a0,pcVar9);
                p->rc = iVar7;
              }
              break;
            }
            if (p->rc != 0) break;
          }
        }
        rbuFinalize(p,pList);
        if (p->rc == 0) {
          local_50 = "PRIMARY KEY(";
          pcVar9 = (char *)0x0;
          do {
            psVar27 = local_c0;
            iVar7 = sqlite3_step(local_c0);
            if (iVar7 != 100) break;
            pMVar10 = columnMem(psVar27,5);
            iVar11 = sqlite3VdbeIntValue(pMVar10);
            columnMallocFailure(psVar27);
            if ((int)iVar11 != 0) {
              puVar12 = sqlite3_column_text(psVar27,2);
              pMVar10 = columnMem(psVar27,3);
              iVar11 = sqlite3VdbeIntValue(pMVar10);
              columnMallocFailure(psVar27);
              pcVar25 = " DESC";
              if ((int)iVar11 == 0) {
                pcVar25 = "";
              }
              pcVar9 = rbuMPrintf(p,"%z%s\"%w\"%s",pcVar9,local_50,puVar12,pcVar25);
              local_50 = ", ";
            }
          } while (p->rc == 0);
        }
        else {
          pcVar9 = (char *)0x0;
        }
        pcVar9 = rbuMPrintf(p,"%z)",pcVar9);
        rbuFinalize(p,local_c0);
      }
      else {
        pcVar9 = (char *)0x0;
      }
      if (pcVar9 != (char *)0x0) {
        local_b8 = rbuMPrintf(p,"%z, %z",local_b8,pcVar9);
      }
    }
    sqlite3_test_control(0x19,p->dbMain,"main",1,(ulong)local_88 & 0xffffffff);
    pcVar9 = "";
    if (pIter->eType == 4) {
      pcVar9 = " WITHOUT ROWID";
    }
    rbuMPrintfExec(p,p->dbMain,"CREATE TABLE \"rbu_imp_%w\"(%z)%s",pIter->zTbl,local_b8,pcVar9);
    sqlite3_test_control(0x19,p->dbMain,"main",0,0);
  }
  if ((p->rc == 0) && (pIter->eType == 3)) {
    iVar7 = pIter->iPkTnum;
    puVar12 = (uchar *)0x0;
    pList = (sqlite3_stmt *)0x0;
    local_c0 = (sqlite3_stmt *)0x0;
    iVar6 = prepareAndCollectError
                      (p->dbMain,&pList,local_a0,"SELECT name FROM sqlite_master WHERE rootpage = ?"
                      );
    psVar27 = pList;
    p->rc = iVar6;
    if (iVar6 == 0) {
      sqlite3_bind_int64(pList,1,(sqlite_int64)(long)iVar7);
      iVar6 = sqlite3_step(psVar27);
      if (iVar6 == 100) {
        puVar12 = sqlite3_column_text(psVar27,0);
      }
      else {
        puVar12 = (uchar *)0x0;
      }
    }
    if (puVar12 != (uchar *)0x0) {
      psVar3 = p->dbMain;
      pcVar9 = sqlite3_mprintf("PRAGMA main.index_xinfo = %Q",puVar12);
      iVar6 = prepareFreeAndCollectError(psVar3,&local_c0,local_a0,pcVar9);
      p->rc = iVar6;
    }
    local_88 = (char *)(long)iVar7;
    rbuFinalize(p,pList);
    if (p->rc == 0) {
      pcVar25 = "";
      pcVar9 = (char *)0x0;
      local_b8 = (char *)0x0;
      do {
        psVar27 = local_c0;
        iVar7 = sqlite3_step(local_c0);
        if (iVar7 != 100) break;
        pMVar10 = columnMem(psVar27,5);
        iVar11 = sqlite3VdbeIntValue(pMVar10);
        columnMallocFailure(psVar27);
        if ((int)iVar11 != 0) {
          pMVar10 = columnMem(psVar27,1);
          uVar18 = sqlite3VdbeIntValue(pMVar10);
          columnMallocFailure(psVar27);
          pMVar10 = columnMem(psVar27,3);
          iVar11 = sqlite3VdbeIntValue(pMVar10);
          columnMallocFailure(psVar27);
          puVar12 = sqlite3_column_text(psVar27,4);
          pcVar9 = rbuMPrintf(p,"%z%sc%d %s COLLATE %Q",pcVar9,pcVar25,uVar18 & 0xffffffff,
                              pIter->azTblType[(int)uVar18],puVar12);
          pcVar16 = " DESC";
          if ((int)iVar11 == 0) {
            pcVar16 = "";
          }
          local_b8 = rbuMPrintf(p,"%z%sc%d%s",local_b8,pcVar25,uVar18 & 0xffffffff,pcVar16);
          pcVar25 = ", ";
        }
      } while (p->rc == 0);
    }
    else {
      local_b8 = (char *)0x0;
      pcVar9 = (char *)0x0;
    }
    pcVar9 = rbuMPrintf(p,"%z, id INTEGER",pcVar9);
    rbuFinalize(p,local_c0);
    sqlite3_test_control(0x19,p->dbMain,"main",1,local_88);
    rbuMPrintfExec(p,p->dbMain,"CREATE TABLE rbu_imposter2(%z, PRIMARY KEY(%z)) WITHOUT ROWID",
                   pcVar9,local_b8);
    sqlite3_test_control(0x19,p->dbMain,"main",0,0);
  }
  pcVar17 = "";
  pcVar9 = "rbu_imp_";
  if (pIter->eType == 5) {
    pcVar9 = "";
  }
  if (p->rc == 0) {
    psVar3 = p->dbMain;
    pcVar25 = "";
    if ((char)local_40 != '\0') {
      pcVar25 = ", _rowid_";
    }
    pcVar25 = sqlite3_mprintf("INSERT INTO \"%s%w\"(%s%s) VALUES(%s)",pcVar9,local_98,local_d8,
                              pcVar25,local_b0);
    iVar7 = prepareFreeAndCollectError(psVar3,&pIter->pInsert,local_a0,pcVar25);
    p->rc = iVar7;
  }
  if ((p->zTarget != (char *)0x0) && (p->rc == 0)) {
    psVar3 = p->dbMain;
    pcVar25 = sqlite3_mprintf("DELETE FROM \"%s%w\" WHERE %s",pcVar9,local_98,local_c8);
    iVar7 = prepareFreeAndCollectError(psVar3,&pIter->pDelete,local_a0,pcVar25);
    p->rc = iVar7;
  }
  if ((p->zTarget != (char *)0x0) && (pIter->abIndexed != (u8 *)0x0)) {
    local_b8 = ", rbu_rowid";
    if ((pIter->eType - 1U & 0xfffffffd) != 0) {
      local_b8 = "";
    }
    local_88 = p->zStateDb;
    pcVar25 = ", 0 AS rbu_rowid";
    if (pIter->eType != 3) {
      pcVar25 = "";
    }
    rbuMPrintfExec(p,p->dbRbu,
                   "CREATE TABLE IF NOT EXISTS %s.\'rbu_tmp_%q\' AS SELECT *%s FROM \'%q\' WHERE 0;"
                   ,local_88,pIter->zDataTbl,pcVar25,pIter->zDataTbl);
    pcVar16 = local_90;
    pcVar25 = local_98;
    rbuMPrintfExec(p,p->dbMain,
                   "CREATE TEMP TRIGGER rbu_delete_tr BEFORE DELETE ON \"%s%w\" BEGIN   SELECT rbu_tmp_insert(3, %s);END;CREATE TEMP TRIGGER rbu_update1_tr BEFORE UPDATE ON \"%s%w\" BEGIN   SELECT rbu_tmp_insert(3, %s);END;CREATE TEMP TRIGGER rbu_update2_tr AFTER UPDATE ON \"%s%w\" BEGIN   SELECT rbu_tmp_insert(4, %s);END;"
                   ,pcVar9,local_98,local_d0,pcVar9,local_98,local_d0,pcVar9,local_98,local_90);
    if ((pIter->eType | 2U) == 3) {
      rbuMPrintfExec(p,p->dbMain,
                     "CREATE TEMP TRIGGER rbu_insert_tr AFTER INSERT ON \"%s%w\" BEGIN   SELECT rbu_tmp_insert(0, %s);END;"
                     ,pcVar9,pcVar25,pcVar16);
    }
    pcVar9 = rbuObjIterGetBindlist(p,pIter->nTblCol + (uint)((pIter->eType & 0xfffffffdU) == 1) + 1)
    ;
    if (pcVar9 != (char *)0x0) {
      psVar3 = p->dbRbu;
      pcVar9 = sqlite3_mprintf("INSERT INTO %s.\'rbu_tmp_%q\'(rbu_control,%s%s) VALUES(%z)",local_88
                               ,pIter->zDataTbl,local_d8,local_b8,pcVar9);
      iVar7 = prepareFreeAndCollectError(psVar3,&pIter->pTmpInsert,local_a0,pcVar9);
      p->rc = iVar7;
    }
  }
  pcVar9 = local_48;
  pcVar16 = local_90;
  pcVar25 = local_b0;
  if (p->rc == 0) {
    pcVar25 = "";
    if (((char)local_40 != '\0') && (pcVar25 = ",rbu_rowid", p->zTarget == (char *)0x0)) {
      pcVar25 = ",_rowid_ ";
    }
    psVar3 = p->dbRbu;
    if (p->zTarget == (char *)0x0) {
      pcVar17 = "0 AS ";
    }
    pcVar25 = sqlite3_mprintf("SELECT %s,%s rbu_control%s FROM \'%q\'%s",local_d8,pcVar17,pcVar25,
                              pIter->zDataTbl,local_48);
    iVar7 = prepareFreeAndCollectError(psVar3,local_38,local_a0,pcVar25);
    p->rc = iVar7;
    pcVar16 = local_90;
    pcVar25 = local_b0;
  }
  goto LAB_001300c2;
  while( true ) {
    pMVar10 = columnMem(psVar27,5);
    iVar11 = sqlite3VdbeIntValue(pMVar10);
    columnMallocFailure(psVar27);
    if (0 < (int)iVar11) break;
LAB_0012f5b3:
    iVar6 = sqlite3_step(psVar27);
    if (iVar6 != 100) {
      iVar6 = 1;
      goto LAB_0012ea52;
    }
  }
  iVar6 = 2;
  goto LAB_0012ea52;
LAB_0012ed30:
  if (puVar12[(int)uVar21] == '\0') {
    pcVar25 = (char *)0x0;
  }
  else {
    pcVar25 = rbuStrndup((char *)(puVar12 + (int)uVar21),(int *)&local_c0);
  }
LAB_0012f718:
  iVar7 = sqlite3_finalize(psVar27);
  if ((int)local_c0 != 0) {
    iVar7 = (int)local_c0;
  }
  local_c0 = (sqlite3_stmt *)CONCAT44(local_c0._4_4_,iVar7);
  uVar21 = (uint)local_50;
LAB_0012f734:
  p->rc = (int)local_c0;
  sqlite3_test_control(0x19,p->dbMain,"main",0,1);
  sqlite3_test_control(0x19,p->dbMain,"main",1,(ulong)uVar21);
  rbuMPrintfExec(p,p->dbMain,"CREATE TABLE \"rbu_imp_%w\"( %s, PRIMARY KEY( %s ) ) WITHOUT ROWID",
                 local_88,pcVar9,local_c8);
  sqlite3_test_control(0x19,p->dbMain,"main",0,0);
  pIter->nCol = (uint)local_98;
  if (p->rc == 0) {
    psVar3 = p->dbMain;
    local_b0 = pcVar9;
    pcVar16 = sqlite3_mprintf("INSERT INTO \"rbu_imp_%w\" VALUES(%s)",local_88,local_90);
    pcVar9 = local_b0;
    iVar7 = prepareFreeAndCollectError(psVar3,&pIter->pInsert,local_a0,pcVar16);
    p->rc = iVar7;
  }
  if ((p->zTarget != (char *)0x0) && (p->rc == 0)) {
    psVar3 = p->dbMain;
    local_b0 = pcVar9;
    pcVar16 = sqlite3_mprintf("DELETE FROM \"rbu_imp_%w\" WHERE %s",local_88,local_d0);
    pcVar9 = local_b0;
    iVar7 = prepareFreeAndCollectError(psVar3,&pIter->pDelete,local_a0,pcVar16);
    p->rc = iVar7;
  }
  pcVar16 = local_90;
  if (p->rc == 0) {
    if (p->zTarget == (char *)0x0) {
      pcVar17 = sqlite3_mprintf("SELECT %s, 0 AS rbu_control FROM \'%q\' %s ORDER BY %s%s",local_d8,
                                pIter->zDataTbl,pcVar25,local_d8,local_48);
    }
    else if ((pIter->eType | 2U) == 3) {
      pcVar17 = sqlite3_mprintf("SELECT %s, rbu_control FROM %s.\'rbu_tmp_%q\' %s ORDER BY %s%s",
                                local_d8,p->zStateDb,pIter->zDataTbl,pcVar25,local_d8,local_48);
    }
    else {
      pcVar17 = "AND";
      if (pcVar25 == (char *)0x0) {
        pcVar17 = "WHERE";
      }
      pcVar17 = sqlite3_mprintf("SELECT %s, rbu_control FROM %s.\'rbu_tmp_%q\' %s UNION ALL SELECT %s, rbu_control FROM \'%q\' %s %s typeof(rbu_control)=\'integer\' AND rbu_control!=1 ORDER BY %s%s"
                                ,local_d8,p->zStateDb,pIter->zDataTbl,pcVar25,local_d8,
                                pIter->zDataTbl,pcVar25,pcVar17,local_d8,local_48);
    }
    iVar7 = prepareFreeAndCollectError(p->dbRbu,local_38,local_a0,pcVar17);
    p->rc = iVar7;
  }
  sqlite3_free(pcVar9);
  pcVar9 = local_48;
LAB_001300c2:
  sqlite3_free(local_c8);
  sqlite3_free(local_d0);
  sqlite3_free(pcVar16);
  sqlite3_free(pcVar25);
  sqlite3_free(local_d8);
  sqlite3_free(pcVar9);
LAB_001300f4:
  return p->rc;
}

Assistant:

static int rbuObjIterPrepareAll(
  sqlite3rbu *p, 
  RbuObjIter *pIter,
  int nOffset                     /* Add "LIMIT -1 OFFSET $nOffset" to SELECT */
){
  assert( pIter->bCleanup==0 );
  if( pIter->pSelect==0 && rbuObjIterCacheTableInfo(p, pIter)==SQLITE_OK ){
    const int tnum = pIter->iTnum;
    char *zCollist = 0;           /* List of indexed columns */
    char **pz = &p->zErrmsg;
    const char *zIdx = pIter->zIdx;
    char *zLimit = 0;

    if( nOffset ){
      zLimit = sqlite3_mprintf(" LIMIT -1 OFFSET %d", nOffset);
      if( !zLimit ) p->rc = SQLITE_NOMEM;
    }

    if( zIdx ){
      const char *zTbl = pIter->zTbl;
      char *zImposterCols = 0;    /* Columns for imposter table */
      char *zImposterPK = 0;      /* Primary key declaration for imposter */
      char *zWhere = 0;           /* WHERE clause on PK columns */
      char *zBind = 0;
      char *zPart = 0;
      int nBind = 0;

      assert( pIter->eType!=RBU_PK_VTAB );
      zCollist = rbuObjIterGetIndexCols(
          p, pIter, &zImposterCols, &zImposterPK, &zWhere, &nBind
      );
      zBind = rbuObjIterGetBindlist(p, nBind);
      zPart = rbuObjIterGetIndexWhere(p, pIter);

      /* Create the imposter table used to write to this index. */
      sqlite3_test_control(SQLITE_TESTCTRL_IMPOSTER, p->dbMain, "main", 0, 1);
      sqlite3_test_control(SQLITE_TESTCTRL_IMPOSTER, p->dbMain, "main", 1,tnum);
      rbuMPrintfExec(p, p->dbMain,
          "CREATE TABLE \"rbu_imp_%w\"( %s, PRIMARY KEY( %s ) ) WITHOUT ROWID",
          zTbl, zImposterCols, zImposterPK
      );
      sqlite3_test_control(SQLITE_TESTCTRL_IMPOSTER, p->dbMain, "main", 0, 0);

      /* Create the statement to insert index entries */
      pIter->nCol = nBind;
      if( p->rc==SQLITE_OK ){
        p->rc = prepareFreeAndCollectError(
            p->dbMain, &pIter->pInsert, &p->zErrmsg,
          sqlite3_mprintf("INSERT INTO \"rbu_imp_%w\" VALUES(%s)", zTbl, zBind)
        );
      }

      /* And to delete index entries */
      if( rbuIsVacuum(p)==0 && p->rc==SQLITE_OK ){
        p->rc = prepareFreeAndCollectError(
            p->dbMain, &pIter->pDelete, &p->zErrmsg,
          sqlite3_mprintf("DELETE FROM \"rbu_imp_%w\" WHERE %s", zTbl, zWhere)
        );
      }

      /* Create the SELECT statement to read keys in sorted order */
      if( p->rc==SQLITE_OK ){
        char *zSql;
        if( rbuIsVacuum(p) ){
          zSql = sqlite3_mprintf(
              "SELECT %s, 0 AS rbu_control FROM '%q' %s ORDER BY %s%s",
              zCollist, 
              pIter->zDataTbl,
              zPart, zCollist, zLimit
          );
        }else

        if( pIter->eType==RBU_PK_EXTERNAL || pIter->eType==RBU_PK_NONE ){
          zSql = sqlite3_mprintf(
              "SELECT %s, rbu_control FROM %s.'rbu_tmp_%q' %s ORDER BY %s%s",
              zCollist, p->zStateDb, pIter->zDataTbl,
              zPart, zCollist, zLimit
          );
        }else{
          zSql = sqlite3_mprintf(
              "SELECT %s, rbu_control FROM %s.'rbu_tmp_%q' %s "
              "UNION ALL "
              "SELECT %s, rbu_control FROM '%q' "
              "%s %s typeof(rbu_control)='integer' AND rbu_control!=1 "
              "ORDER BY %s%s",
              zCollist, p->zStateDb, pIter->zDataTbl, zPart,
              zCollist, pIter->zDataTbl, 
              zPart,
              (zPart ? "AND" : "WHERE"),
              zCollist, zLimit
          );
        }
        p->rc = prepareFreeAndCollectError(p->dbRbu, &pIter->pSelect, pz, zSql);
      }

      sqlite3_free(zImposterCols);
      sqlite3_free(zImposterPK);
      sqlite3_free(zWhere);
      sqlite3_free(zBind);
      sqlite3_free(zPart);
    }else{
      int bRbuRowid = (pIter->eType==RBU_PK_VTAB)
                    ||(pIter->eType==RBU_PK_NONE)
                    ||(pIter->eType==RBU_PK_EXTERNAL && rbuIsVacuum(p));
      const char *zTbl = pIter->zTbl;       /* Table this step applies to */
      const char *zWrite;                   /* Imposter table name */

      char *zBindings = rbuObjIterGetBindlist(p, pIter->nTblCol + bRbuRowid);
      char *zWhere = rbuObjIterGetWhere(p, pIter);
      char *zOldlist = rbuObjIterGetOldlist(p, pIter, "old");
      char *zNewlist = rbuObjIterGetOldlist(p, pIter, "new");

      zCollist = rbuObjIterGetCollist(p, pIter);
      pIter->nCol = pIter->nTblCol;

      /* Create the imposter table or tables (if required). */
      rbuCreateImposterTable(p, pIter);
      rbuCreateImposterTable2(p, pIter);
      zWrite = (pIter->eType==RBU_PK_VTAB ? "" : "rbu_imp_");

      /* Create the INSERT statement to write to the target PK b-tree */
      if( p->rc==SQLITE_OK ){
        p->rc = prepareFreeAndCollectError(p->dbMain, &pIter->pInsert, pz,
            sqlite3_mprintf(
              "INSERT INTO \"%s%w\"(%s%s) VALUES(%s)", 
              zWrite, zTbl, zCollist, (bRbuRowid ? ", _rowid_" : ""), zBindings
            )
        );
      }

      /* Create the DELETE statement to write to the target PK b-tree.
      ** Because it only performs INSERT operations, this is not required for
      ** an rbu vacuum handle.  */
      if( rbuIsVacuum(p)==0 && p->rc==SQLITE_OK ){
        p->rc = prepareFreeAndCollectError(p->dbMain, &pIter->pDelete, pz,
            sqlite3_mprintf(
              "DELETE FROM \"%s%w\" WHERE %s", zWrite, zTbl, zWhere
            )
        );
      }

      if( rbuIsVacuum(p)==0 && pIter->abIndexed ){
        const char *zRbuRowid = "";
        if( pIter->eType==RBU_PK_EXTERNAL || pIter->eType==RBU_PK_NONE ){
          zRbuRowid = ", rbu_rowid";
        }

        /* Create the rbu_tmp_xxx table and the triggers to populate it. */
        rbuMPrintfExec(p, p->dbRbu,
            "CREATE TABLE IF NOT EXISTS %s.'rbu_tmp_%q' AS "
            "SELECT *%s FROM '%q' WHERE 0;"
            , p->zStateDb, pIter->zDataTbl
            , (pIter->eType==RBU_PK_EXTERNAL ? ", 0 AS rbu_rowid" : "")
            , pIter->zDataTbl
        );

        rbuMPrintfExec(p, p->dbMain,
            "CREATE TEMP TRIGGER rbu_delete_tr BEFORE DELETE ON \"%s%w\" "
            "BEGIN "
            "  SELECT rbu_tmp_insert(3, %s);"
            "END;"

            "CREATE TEMP TRIGGER rbu_update1_tr BEFORE UPDATE ON \"%s%w\" "
            "BEGIN "
            "  SELECT rbu_tmp_insert(3, %s);"
            "END;"

            "CREATE TEMP TRIGGER rbu_update2_tr AFTER UPDATE ON \"%s%w\" "
            "BEGIN "
            "  SELECT rbu_tmp_insert(4, %s);"
            "END;",
            zWrite, zTbl, zOldlist,
            zWrite, zTbl, zOldlist,
            zWrite, zTbl, zNewlist
        );

        if( pIter->eType==RBU_PK_EXTERNAL || pIter->eType==RBU_PK_NONE ){
          rbuMPrintfExec(p, p->dbMain,
              "CREATE TEMP TRIGGER rbu_insert_tr AFTER INSERT ON \"%s%w\" "
              "BEGIN "
              "  SELECT rbu_tmp_insert(0, %s);"
              "END;",
              zWrite, zTbl, zNewlist
          );
        }

        rbuObjIterPrepareTmpInsert(p, pIter, zCollist, zRbuRowid);
      }

      /* Create the SELECT statement to read keys from data_xxx */
      if( p->rc==SQLITE_OK ){
        const char *zRbuRowid = "";
        if( bRbuRowid ){
          zRbuRowid = rbuIsVacuum(p) ? ",_rowid_ " : ",rbu_rowid";
        }
        p->rc = prepareFreeAndCollectError(p->dbRbu, &pIter->pSelect, pz,
            sqlite3_mprintf(
              "SELECT %s,%s rbu_control%s FROM '%q'%s", 
              zCollist, 
              (rbuIsVacuum(p) ? "0 AS " : ""),
              zRbuRowid,
              pIter->zDataTbl, zLimit
            )
        );
      }

      sqlite3_free(zWhere);
      sqlite3_free(zOldlist);
      sqlite3_free(zNewlist);
      sqlite3_free(zBindings);
    }
    sqlite3_free(zCollist);
    sqlite3_free(zLimit);
  }
  
  return p->rc;
}